

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateYield(ExpressionEvalContext *ctx,ExprYield *expression)

{
  StackFrame *pSVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  bool bVar5;
  int iVar6;
  StackFrame **ppSVar7;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  
  bVar5 = AddInstruction(ctx);
  if (!bVar5) {
    return (ExprBase *)0x0;
  }
  ppSVar7 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pSVar1 = *ppSVar7;
  if (pSVar1->targetYield == expression->order) {
    pSVar1->targetYield = 0;
  }
  else if (pSVar1->targetYield == 0) {
    pEVar8 = Evaluate(ctx,expression->value);
    if (pEVar8 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    if ((ctx->stackFrames).count == 0) {
      Report(ctx,"ERROR: no stack frame to return from");
      return (ExprBase *)0x0;
    }
    pSVar1->returnValue = pEVar8;
    if ((expression->coroutineStateUpdate != (ExprBase *)0x0) &&
       (pEVar8 = Evaluate(ctx,expression->coroutineStateUpdate), pEVar8 == (ExprBase *)0x0)) {
      return (ExprBase *)0x0;
    }
    if ((expression->closures != (ExprBase *)0x0) &&
       (pEVar8 = Evaluate(ctx,expression->closures), pEVar8 == (ExprBase *)0x0)) {
      return (ExprBase *)0x0;
    }
  }
  pAVar2 = ctx->ctx->allocator;
  iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
  pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar6);
  pSVar3 = (expression->super_ExprBase).source;
  pTVar4 = ctx->ctx->typeVoid;
  pEVar8->typeID = 2;
  pEVar8->source = pSVar3;
  pEVar8->type = pTVar4;
  pEVar8->next = (ExprBase *)0x0;
  pEVar8->listed = false;
  pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223678;
  pEVar8 = CheckType(&expression->super_ExprBase,pEVar8);
  return pEVar8;
}

Assistant:

ExprBase* EvaluateYield(ExpressionEvalContext &ctx, ExprYield *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	// Check if we reached target yield
	if(frame->targetYield == expression->order)
	{
		frame->targetYield = 0;

		return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
	}

	if(frame->targetYield)
		return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(ctx.stackFrames.empty())
		return Report(ctx, "ERROR: no stack frame to return from");

	frame->returnValue = value;

	if(expression->coroutineStateUpdate)
	{
		if(!Evaluate(ctx, expression->coroutineStateUpdate))
			return NULL;
	}

	if(expression->closures)
	{
		if(!Evaluate(ctx, expression->closures))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}